

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_conn.cpp
# Opt level: O0

void __thiscall TcpConnection::do_close(TcpConnection *this)

{
  TcpServer *this_00;
  bool bVar1;
  enable_shared_from_this<TcpConnection> local_28;
  int local_14;
  TcpConnection *pTStack_10;
  int fd;
  TcpConnection *this_local;
  
  pTStack_10 = this;
  bVar1 = std::function::operator_cast_to_bool((function *)&this->tc_close_cb);
  if (bVar1) {
    std::function<void_()>::operator()(&this->tc_close_cb);
  }
  EventLoop::del_from_poller(this->tc_loop,this->tc_fd);
  BufferBase::clear(&(this->tc_ibuf).super_BufferBase);
  BufferBase::clear(&(this->tc_obuf).super_BufferBase);
  local_14 = this->tc_fd;
  this->tc_fd = -1;
  close(local_14);
  this_00 = this->tc_server;
  std::enable_shared_from_this<TcpConnection>::shared_from_this(&local_28);
  TcpServer::do_clean(this_00,(TcpConnSP *)&local_28);
  std::shared_ptr<TcpConnection>::~shared_ptr((shared_ptr<TcpConnection> *)&local_28);
  return;
}

Assistant:

void TcpConnection::do_close() {
    if (tc_close_cb) {
        tc_close_cb();
    }

    tc_loop->del_from_poller(tc_fd);
    tc_ibuf.clear(); 
    tc_obuf.clear();

    int fd = tc_fd;
    tc_fd = -1;
    close(fd);

    tc_server->do_clean(shared_from_this());
}